

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O0

void column_test_boundary_z5_operators<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>
               (vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
                *matrix)

{
  initializer_list<unsigned_int> __l;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_05;
  initializer_list<unsigned_int> __l_06;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_07;
  undefined8 uVar1;
  bool bVar2;
  reference pvVar3;
  size_type sVar4;
  lazy_ostream *plVar5;
  undefined4 local_a3c;
  size_t local_a38;
  basic_cstring<const_char> local_a30;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_a20;
  basic_cstring<const_char> local_9f8;
  basic_cstring<const_char> local_9e8;
  basic_cstring<const_char> local_9d8;
  basic_cstring<const_char> local_9c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_9b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_998;
  assertion_result local_980;
  basic_cstring<const_char> local_968;
  basic_cstring<const_char> local_958;
  uint local_948 [8];
  iterator local_928;
  undefined8 local_920;
  Field_element local_918;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_911;
  int local_910 [12];
  pair<unsigned_int,_unsigned_int> local_8e0;
  pair<unsigned_int,_unsigned_int> local_8d8;
  pair<unsigned_int,_unsigned_int> local_8d0;
  pair<unsigned_int,_unsigned_int> local_8c8;
  pair<unsigned_int,_unsigned_int> local_8c0;
  pair<unsigned_int,_unsigned_int> local_8b8;
  iterator local_8b0;
  size_type local_8a8;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_8a0;
  undefined1 local_888 [8];
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  col4;
  size_t local_858;
  basic_cstring<const_char> local_850;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_840;
  basic_cstring<const_char> local_818;
  basic_cstring<const_char> local_808;
  basic_cstring<const_char> local_7f8;
  basic_cstring<const_char> local_7e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_7d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_7b8;
  assertion_result local_7a0;
  basic_cstring<const_char> local_788;
  basic_cstring<const_char> local_778;
  uint local_768 [8];
  iterator local_748;
  undefined8 local_740;
  Field_element local_738;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_731;
  int local_730 [10];
  pair<unsigned_int,_unsigned_int> local_708;
  pair<unsigned_int,_unsigned_int> local_700;
  pair<unsigned_int,_unsigned_int> local_6f8;
  pair<unsigned_int,_unsigned_int> local_6f0;
  pair<unsigned_int,_unsigned_int> local_6e8;
  iterator local_6e0;
  size_type local_6d8;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_6d0;
  undefined1 local_6b8 [8];
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  col3;
  size_t local_688;
  basic_cstring<const_char> local_680;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_670;
  basic_cstring<const_char> local_648;
  basic_cstring<const_char> local_638;
  basic_cstring<const_char> local_628;
  basic_cstring<const_char> local_618;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_608;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_5e8;
  assertion_result local_5d0;
  basic_cstring<const_char> local_5b8;
  basic_cstring<const_char> local_5a8;
  uint local_598 [10];
  iterator local_570;
  undefined8 local_568;
  Field_element local_55c;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_558;
  undefined1 local_538 [8];
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  col2;
  size_t local_508;
  basic_cstring<const_char> local_500;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_4f0;
  basic_cstring<const_char> local_4c8;
  basic_cstring<const_char> local_4b8;
  basic_cstring<const_char> local_4a8;
  basic_cstring<const_char> local_498;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_488;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_468;
  assertion_result local_450;
  basic_cstring<const_char> local_438;
  basic_cstring<const_char> local_428;
  uint local_418 [10];
  iterator local_3f0;
  undefined8 local_3e8;
  Field_element local_3e0 [2];
  size_t local_3d8;
  basic_cstring<const_char> local_3d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_3c0;
  basic_cstring<const_char> local_398;
  basic_cstring<const_char> local_388;
  basic_cstring<const_char> local_378;
  basic_cstring<const_char> local_368;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_358;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_338;
  assertion_result local_320;
  basic_cstring<const_char> local_308;
  basic_cstring<const_char> local_2f8;
  initializer_list<unsigned_int> local_2e8;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_2d1;
  int local_2d0 [10];
  pair<unsigned_int,_unsigned_int> local_2a8;
  pair<unsigned_int,_unsigned_int> local_2a0;
  pair<unsigned_int,_unsigned_int> local_298;
  pair<unsigned_int,_unsigned_int> local_290;
  pair<unsigned_int,_unsigned_int> local_288;
  iterator local_280;
  size_type local_278;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_270;
  undefined1 local_258 [8];
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  col1;
  size_t local_228;
  basic_cstring<const_char> local_220;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_210;
  basic_cstring<const_char> local_1e8;
  basic_cstring<const_char> local_1d8;
  basic_cstring<const_char> local_1c8;
  basic_cstring<const_char> local_1b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_188;
  assertion_result local_170;
  basic_cstring<const_char> local_158;
  basic_cstring<const_char> local_148;
  uint local_138 [8];
  iterator local_118;
  undefined8 local_110;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_101;
  int local_100 [10];
  pair<unsigned_int,_unsigned_int> local_d8;
  pair<unsigned_int,_unsigned_int> local_d0;
  pair<unsigned_int,_unsigned_int> local_c8;
  pair<unsigned_int,_unsigned_int> local_c0;
  pair<unsigned_int,_unsigned_int> local_b8;
  iterator local_b0;
  size_type local_a8;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_a0;
  undefined1 local_88 [8];
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  col0;
  undefined1 local_50 [8];
  Column_settings settings;
  vector<unsigned_int,_std::allocator<unsigned_int>_> veccont;
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
  *matrix_local;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20);
  Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>
  ::Column_zp_settings::Column_zp_settings((Column_zp_settings *)local_50,5);
  local_100[9] = 0;
  local_100[8] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_d8,local_100 + 9,local_100 + 8)
  ;
  local_100[7] = 1;
  local_100[6] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_d0,local_100 + 7,local_100 + 6)
  ;
  local_100[5] = 2;
  local_100[4] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_c8,local_100 + 5,local_100 + 4)
  ;
  local_100[3] = 5;
  local_100[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_c0,local_100 + 3,local_100 + 2)
  ;
  local_100[1] = 6;
  local_100[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_b8,local_100 + 1,local_100);
  local_b0 = &local_d8;
  local_a8 = 5;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_101);
  __l_07._M_len = local_a8;
  __l_07._M_array = local_b0;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_a0,__l_07,&local_101);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>
  ::
  Intrusive_list_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>
              *)local_88,&local_a0,(Column_settings *)local_50);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_a0);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_101);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,0);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>
  ::operator+=((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>
                *)pvVar3,
               (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
                *)local_88);
  local_138[4] = 0;
  local_138[5] = 0;
  local_138[6] = 1;
  local_138[0] = 0;
  local_138[1] = 4;
  local_138[2] = 1;
  local_138[3] = 3;
  local_118 = local_138;
  local_110 = 7;
  __l_06._M_len = 7;
  __l_06._M_array = local_118;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20,__l_06);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_148,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_158);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_148,0x386,&local_158);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,0);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20);
    Gudhi::persistence_matrix::
    Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
    ::get_content(&local_188,pvVar3,(int)sVar4);
    bVar2 = std::operator==(&local_188,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &settings.field_0x20);
    boost::test_tools::assertion_result::assertion_result(&local_170,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b8,"matrix[0].get_content(veccont.size()) == veccont",0x30);
    boost::unit_test::operator<<(&local_1a8,plVar5,&local_1b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_170,&local_1a8,&local_1c8,0x386,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1a8);
    boost::test_tools::assertion_result::~assertion_result(&local_170);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1d8,0x388,&local_1e8);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_210,plVar5,(char (*) [1])0x1f0133);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,0);
    local_228 = Gudhi::persistence_matrix::
                Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
                ::size(pvVar3);
    col1.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_._4_4_ = 4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_210,&local_220,0x388,1,2,&local_228,"matrix[0].size()",
               (undefined1 *)
               ((long)&col1.column_.super_type.data_.root_plus_size_.m_header.super_node + 0xc),"4")
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_210);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_2d0[9] = 0;
  local_2d0[8] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_2a8,local_2d0 + 9,local_2d0 + 8);
  local_2d0[7] = 1;
  local_2d0[6] = 3;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_2a0,local_2d0 + 7,local_2d0 + 6);
  local_2d0[5] = 2;
  local_2d0[4] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_298,local_2d0 + 5,local_2d0 + 4);
  local_2d0[3] = 5;
  local_2d0[2] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_290,local_2d0 + 3,local_2d0 + 2);
  local_2d0[1] = 6;
  local_2d0[0] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_288,local_2d0 + 1,local_2d0);
  local_280 = &local_2a8;
  local_278 = 5;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_2d1);
  __l_05._M_len = local_278;
  __l_05._M_array = local_280;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_270,__l_05,&local_2d1);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>
  ::
  Intrusive_list_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>
              *)local_258,&local_270,(Column_settings *)local_50);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_270);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_2d1);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,1);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>
  ::operator+=((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>
                *)pvVar3,
               (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
                *)local_258);
  std::initializer_list<unsigned_int>::initializer_list(&local_2e8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20,local_2e8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_308);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2f8,0x38f,&local_308);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,1);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20);
    Gudhi::persistence_matrix::
    Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
    ::get_content(&local_338,pvVar3,(int)sVar4);
    bVar2 = std::operator==(&local_338,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &settings.field_0x20);
    boost::test_tools::assertion_result::assertion_result(&local_320,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_368,"matrix[1].get_content(veccont.size()) == veccont",0x30);
    boost::unit_test::operator<<(&local_358,plVar5,&local_368);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_378,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_320,&local_358,&local_378,0x38f,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_358);
    boost::test_tools::assertion_result::~assertion_result(&local_320);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_338);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_388,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_398);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_388,0x391,&local_398);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_3c0,plVar5,(char (*) [1])0x1f0133);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,1);
    local_3d8 = Gudhi::persistence_matrix::
                Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
                ::size(pvVar3);
    local_3e0[1] = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_3c0,&local_3d0,0x391,1,2,&local_3d8,"matrix[1].size()",local_3e0 + 1,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_3c0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,4);
  local_3e0[0] = 4;
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>
  ::
  multiply_target_and_add<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>
            ((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>
              *)pvVar3,local_3e0,
             (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
              *)local_258);
  local_418[4] = 0;
  local_418[5] = 0;
  local_418[6] = 4;
  local_418[0] = 0;
  local_418[1] = 1;
  local_418[2] = 4;
  local_418[3] = 2;
  local_3f0 = local_418;
  local_3e8 = 7;
  __l_04._M_len = 7;
  __l_04._M_array = local_3f0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20,__l_04);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_438);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_428,0x397,&local_438);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,4);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20);
    Gudhi::persistence_matrix::
    Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
    ::get_content(&local_468,pvVar3,(int)sVar4);
    bVar2 = std::operator==(&local_468,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &settings.field_0x20);
    boost::test_tools::assertion_result::assertion_result(&local_450,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_498,"matrix[4].get_content(veccont.size()) == veccont",0x30);
    boost::unit_test::operator<<(&local_488,plVar5,&local_498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4a8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_450,&local_488,&local_4a8,0x397,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_488);
    boost::test_tools::assertion_result::~assertion_result(&local_450);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_468);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4c8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4b8,0x399,&local_4c8);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_4f0,plVar5,(char (*) [1])0x1f0133);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_500,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,4);
    local_508 = Gudhi::persistence_matrix::
                Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
                ::size(pvVar3);
    col2.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_._4_4_ = 4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_4f0,&local_500,0x399,1,2,&local_508,"matrix[4].size()",
               (undefined1 *)
               ((long)&col2.column_.super_type.data_.root_plus_size_.m_header.super_node + 0xc),"4")
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_4f0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_558.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_558.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_558.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_558);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>
  ::
  Intrusive_list_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>
              *)local_538,&local_558,(Column_settings *)local_50);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_558);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,5);
  local_55c = 3;
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>
  ::
  multiply_source_and_add<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>
            ((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>
              *)pvVar3,
             (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
              *)local_538,&local_55c);
  local_598[4] = 0;
  local_598[5] = 1;
  local_598[6] = 1;
  local_598[0] = 4;
  local_598[1] = 2;
  local_598[2] = 1;
  local_598[3] = 0;
  local_570 = local_598;
  local_568 = 7;
  __l_03._M_len = 7;
  __l_03._M_array = local_570;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20,__l_03);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5a8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5b8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5a8,0x39f,&local_5b8);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,5);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20);
    Gudhi::persistence_matrix::
    Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
    ::get_content(&local_5e8,pvVar3,(int)sVar4);
    bVar2 = std::operator==(&local_5e8,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &settings.field_0x20);
    boost::test_tools::assertion_result::assertion_result(&local_5d0,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_618,"matrix[5].get_content(veccont.size()) == veccont",0x30);
    boost::unit_test::operator<<(&local_608,plVar5,&local_618);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_628,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_5d0,&local_608,&local_628,0x39f,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_608);
    boost::test_tools::assertion_result::~assertion_result(&local_5d0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_5e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_638,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_648);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_638,0x3a0,&local_648);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_670,plVar5,(char (*) [1])0x1f0133);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_680,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,5);
    local_688 = Gudhi::persistence_matrix::
                Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
                ::size(pvVar3);
    col3.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_._4_4_ = 5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_670,&local_680,0x3a0,1,2,&local_688,"matrix[5].size()",
               (undefined1 *)
               ((long)&col3.column_.super_type.data_.root_plus_size_.m_header.super_node + 0xc),"5")
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_670);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_730[9] = 0;
  local_730[8] = 3;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_708,local_730 + 9,local_730 + 8);
  local_730[7] = 2;
  local_730[6] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_700,local_730 + 7,local_730 + 6);
  local_730[5] = 3;
  local_730[4] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_6f8,local_730 + 5,local_730 + 4);
  local_730[3] = 5;
  local_730[2] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_6f0,local_730 + 3,local_730 + 2);
  local_730[1] = 6;
  local_730[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_6e8,local_730 + 1,local_730);
  local_6e0 = &local_708;
  local_6d8 = 5;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_731);
  __l_02._M_len = local_6d8;
  __l_02._M_array = local_6e0;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_6d0,__l_02,&local_731);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>
  ::
  Intrusive_list_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>
              *)local_6b8,&local_6d0,(Column_settings *)local_50);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_6d0);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_731);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,5);
  local_738 = 3;
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>
  ::
  multiply_source_and_add<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>
            ((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>
              *)pvVar3,
             (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
              *)local_6b8,&local_738);
  local_768[4] = 0;
  local_768[5] = 2;
  local_768[6] = 4;
  local_768[0] = 3;
  local_768[1] = 2;
  local_768[2] = 4;
  local_768[3] = 1;
  local_748 = local_768;
  local_740 = 7;
  __l_01._M_len = 7;
  __l_01._M_array = local_748;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20,__l_01);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_778,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_788);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_778,0x3a5,&local_788);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,5);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20);
    Gudhi::persistence_matrix::
    Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
    ::get_content(&local_7b8,pvVar3,(int)sVar4);
    bVar2 = std::operator==(&local_7b8,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &settings.field_0x20);
    boost::test_tools::assertion_result::assertion_result(&local_7a0,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7e8,"matrix[5].get_content(veccont.size()) == veccont",0x30);
    boost::unit_test::operator<<(&local_7d8,plVar5,&local_7e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_7a0,&local_7d8,&local_7f8,0x3a5,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_7d8);
    boost::test_tools::assertion_result::~assertion_result(&local_7a0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_7b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_808,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_818);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_808,0x3a7,&local_818);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_840,plVar5,(char (*) [1])0x1f0133);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_850,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,5);
    local_858 = Gudhi::persistence_matrix::
                Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
                ::size(pvVar3);
    col4.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_._4_4_ = 6;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_840,&local_850,0x3a7,1,2,&local_858,"matrix[5].size()",
               (undefined1 *)
               ((long)&col4.column_.super_type.data_.root_plus_size_.m_header.super_node + 0xc),"6")
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_840);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_910[0xb] = 0;
  local_910[10] = 3;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_8e0,local_910 + 0xb,local_910 + 10);
  local_910[9] = 1;
  local_910[8] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_8d8,local_910 + 9,local_910 + 8);
  local_910[7] = 2;
  local_910[6] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_8d0,local_910 + 7,local_910 + 6);
  local_910[5] = 3;
  local_910[4] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_8c8,local_910 + 5,local_910 + 4);
  local_910[3] = 5;
  local_910[2] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_8c0,local_910 + 3,local_910 + 2);
  local_910[1] = 6;
  local_910[0] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_8b8,local_910 + 1,local_910);
  local_8b0 = &local_8e0;
  local_8a8 = 6;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_911);
  __l_00._M_len = local_8a8;
  __l_00._M_array = local_8b0;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_8a0,__l_00,&local_911);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>
  ::
  Intrusive_list_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>
              *)local_888,&local_8a0,(Column_settings *)local_50);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_8a0);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_911);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           ::operator[](matrix,3);
  local_918 = 4;
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>
  ::
  multiply_target_and_add<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>
            ((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>
              *)pvVar3,&local_918,
             (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
              *)local_888);
  local_948[4] = 0;
  local_948[5] = 2;
  local_948[6] = 4;
  local_948[0] = 3;
  local_948[1] = 2;
  local_948[2] = 4;
  local_948[3] = 1;
  local_928 = local_948;
  local_920 = 7;
  __l._M_len = 7;
  __l._M_array = local_928;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20,__l);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_958,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_968);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_958,0x3ad,&local_968);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,3);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20);
    Gudhi::persistence_matrix::
    Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
    ::get_content(&local_998,pvVar3,(int)sVar4);
    bVar2 = std::operator==(&local_998,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &settings.field_0x20);
    boost::test_tools::assertion_result::assertion_result(&local_980,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9c8,"matrix[3].get_content(veccont.size()) == veccont",0x30);
    boost::unit_test::operator<<(&local_9b8,plVar5,&local_9c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_980,&local_9b8,&local_9d8,0x3ad,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_9b8);
    boost::test_tools::assertion_result::~assertion_result(&local_980);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_998);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_9f8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_9e8,0x3af,&local_9f8);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_a20,plVar5,(char (*) [1])0x1f0133);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a30,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             ::operator[](matrix,3);
    local_a38 = Gudhi::persistence_matrix::
                Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
                ::size(pvVar3);
    local_a3c = 6;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_a20,&local_a30,0x3af,1,2,&local_a38,"matrix[3].size()",&local_a3c,"6");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_a20);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  ::~Intrusive_list_column
            ((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
              *)local_888);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  ::~Intrusive_list_column
            ((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
              *)local_6b8);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  ::~Intrusive_list_column
            ((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
              *)local_538);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  ::~Intrusive_list_column
            ((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
              *)local_258);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  ::~Intrusive_list_column
            ((Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
              *)local_88);
  Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>
  ::Column_zp_settings::~Column_zp_settings((Column_zp_settings *)local_50);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&settings.field_0x20);
  return;
}

Assistant:

void column_test_boundary_z5_operators(std::vector<Column>& matrix) {
  using cont = std::vector<std::pair<unsigned int, typename Column::Field_element> >;

  std::vector<typename Column::Field_element> veccont;
  typename Column::Column_settings settings(5);

  const Column col0(cont{{0, 4}, {1, 2}, {2, 1}, {5, 1}, {6, 1}}, &settings);
  matrix[0] += col0;

  veccont = {0, 4, 1, 3, 0, 0, 1};
  BOOST_CHECK(matrix[0].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[0].size(), 4);
  }

  const Column col1(cont{{0, 1}, {1, 3}, {2, 4}, {5, 4}, {6, 4}}, &settings);
  matrix[1] += col1;

  veccont = {};
  BOOST_CHECK(matrix[1].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[1].size(), 0);
  }

  // this = v * this + column
  matrix[4].multiply_target_and_add(4, col1);
  veccont = {0, 1, 4, 2, 0, 0, 4};
  BOOST_CHECK(matrix[4].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[4].size(), 4);
  }
  // this = this + column * v
  const Column col2(cont{}, &settings);
  matrix[5].multiply_source_and_add(col2, 3);
  veccont = {4, 2, 1, 0, 0, 1, 1};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(matrix[5].size(), 5);
  // this = this + column * v
  const Column col3(cont{{0, 3}, {2, 1}, {3, 2}, {5, 2}, {6, 1}}, &settings);
  matrix[5].multiply_source_and_add(col3, 3);
  veccont = {3, 2, 4, 1, 0, 2, 4};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 6);
  }
  // this = v * this + column
  const Column col4(cont{{0, 3}, {1, 2}, {2, 4}, {3, 1}, {5, 2}, {6, 4}}, &settings);
  matrix[3].multiply_target_and_add(4, col4);
  veccont = {3, 2, 4, 1, 0, 2, 4};
  BOOST_CHECK(matrix[3].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[3].size(), 6);
  }
}